

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result *
pugi::impl::anon_unknown_0::load_stream_impl<char>
          (xml_document_struct *doc,basic_istream<char,_std::char_traits<char>_> *stream,
          uint options,xml_encoding encoding,char_t **out_buffer)

{
  xml_encoding encoding_00;
  ulong uVar1;
  streamoff sVar2;
  undefined4 in_ECX;
  void **in_RDX;
  basic_istream<char,_std::char_traits<char>_> *in_RSI;
  xml_parse_result *in_RDI;
  undefined4 in_R8D;
  undefined1 auVar3 [16];
  void **unaff_retaddr;
  basic_istream<char,_std::char_traits<char>_> *in_stack_00000008;
  xml_encoding real_encoding;
  xml_parse_status status;
  size_t size;
  void *buffer;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  xml_parse_result *size_00;
  undefined4 in_stack_ffffffffffffffb0;
  xml_parse_status local_34;
  size_t size_01;
  
  size_01 = 0;
  size_00 = in_RDI;
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    auVar3 = std::istream::tellg();
    sVar2 = std::fpos::operator_cast_to_long((fpos *)&stack0xffffffffffffffb8);
    if (sVar2 < 0) {
      std::ios::clear((long)in_RDX + *(long *)((long)*in_RDX + -0x18),0);
      local_34 = load_stream_data_noseek<char>(in_RSI,in_RDX,(size_t *)CONCAT44(in_ECX,in_R8D));
    }
    else {
      local_34 = load_stream_data_seek<char>(in_stack_00000008,unaff_retaddr,(size_t *)in_RSI);
    }
    if (local_34 == status_ok) {
      encoding_00 = get_buffer_encoding((xml_encoding)in_stack_ffffffffffffff80,
                                        (void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                         in_stack_ffffffffffffff78),
                                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ));
      zero_terminate_buffer((void *)0x0,size_01,encoding_00);
      load_buffer_impl(auVar3._8_8_,auVar3._0_8_,
                       (void *)CONCAT44(encoding_00,in_stack_ffffffffffffffb0),(size_t)size_00,
                       (uint)((ulong)in_RDI >> 0x20),(xml_encoding)size_01,
                       SUB81((ulong)in_RDI >> 0x18,0),SUB81((ulong)in_RDI >> 0x10,0),
                       (char_t **)CONCAT44(in_ECX,in_R8D));
    }
    else {
      make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  else {
    make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  return size_00;
}

Assistant:

PUGI__FN xml_parse_result load_stream_impl(xml_document_struct* doc, std::basic_istream<T>& stream, unsigned int options, xml_encoding encoding, char_t** out_buffer)
	{
		void* buffer = 0;
		size_t size = 0;
		xml_parse_status status = status_ok;

		// if stream has an error bit set, bail out (otherwise tellg() can fail and we'll clear error bits)
		if (stream.fail()) return make_parse_result(status_io_error);

		// load stream to memory (using seek-based implementation if possible, since it's faster and takes less memory)
		if (stream.tellg() < 0)
		{
			stream.clear(); // clear error flags that could be set by a failing tellg
			status = load_stream_data_noseek(stream, &buffer, &size);
		}
		else
			status = load_stream_data_seek(stream, &buffer, &size);

		if (status != status_ok) return make_parse_result(status);

		xml_encoding real_encoding = get_buffer_encoding(encoding, buffer, size);

		return load_buffer_impl(doc, doc, buffer, zero_terminate_buffer(buffer, size, real_encoding), options, real_encoding, true, true, out_buffer);
	}